

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemStoreType(Mem *pMem)

{
  ushort uVar1;
  int flags;
  Mem *pMem_local;
  
  uVar1 = pMem->flags;
  if ((uVar1 & 1) == 0) {
    if ((uVar1 & 4) == 0) {
      if ((uVar1 & 8) == 0) {
        if ((uVar1 & 2) == 0) {
          pMem->type = '\x04';
        }
        else {
          pMem->type = '\x03';
        }
      }
      else {
        pMem->type = '\x02';
      }
    }
    else {
      pMem->type = '\x01';
    }
  }
  else {
    pMem->type = '\x05';
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemStoreType(Mem *pMem){
  int flags = pMem->flags;
  if( flags & MEM_Null ){
    pMem->type = SQLITE_NULL;
  }
  else if( flags & MEM_Int ){
    pMem->type = SQLITE_INTEGER;
  }
  else if( flags & MEM_Real ){
    pMem->type = SQLITE_FLOAT;
  }
  else if( flags & MEM_Str ){
    pMem->type = SQLITE_TEXT;
  }else{
    pMem->type = SQLITE_BLOB;
  }
}